

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall
indigox::utils::
Graph<indigox::NTDVertProp,_indigox::utils::NoProperty,_indigox::utils::DirectedGraph>::RemoveVertex
          (Graph<indigox::NTDVertProp,_indigox::utils::NoProperty,_indigox::utils::DirectedGraph>
           *this,VertType v)

{
  left_map *this_00;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  bVar1;
  VertType local_20;
  
  local_20 = v;
  boost::
  clear_vertex<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>
            (v,(bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config>
                *)(this->graph_).
                  super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr);
  boost::
  remove_vertex<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config,boost::bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>>
            (v,&((this->graph_).
                 super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_type);
  this_00 = &(this->vert_idxmap_).left;
  bVar1.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
                *)boost::bimaps::container_adaptor::associative_container_adaptor<$25d008e8$>::
                  find<void_*>((associative_container_adaptor<_25d008e8_> *)this_00,&local_20);
  if (bVar1.node !=
      (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
       *)*(bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
           *)&(this->vert_idxmap_).left.super_map_adaptor<_1e6ad140_>.
              super_ordered_associative_container_adaptor<_140da2db_>.super_type.super_type.dwfb.
              data[-4].super_type) {
    boost::bimaps::container_adaptor::associative_container_adaptor<$25d008e8$>::erase<void_*>
              ((associative_container_adaptor<_25d008e8_> *)this_00,&local_20);
  }
  return;
}

Assistant:

void RemoveVertex(VertType v)
      {
        boost::clear_vertex(v, *graph_);
        boost::remove_vertex(v, *graph_);
        if (vert_idxmap_.left.find(v) != vert_idxmap_.left.end()) {
          vert_idxmap_.left.erase(v);
        }
        
      }